

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,spv_parsed_instruction_t *inst,DebugScope *dbg_scope)

{
  spv_parsed_operand_t *psVar1;
  uint32_t uVar2;
  uint32_t i;
  ulong uVar3;
  long lVar4;
  uint32_t *local_40;
  uint32_t *local_38;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003adc30;
  this->context_ = c;
  this->opcode_ = (uint)inst->opcode;
  this->has_type_id_ = inst->type_id != 0;
  this->has_result_id_ = inst->result_id != 0;
  uVar2 = IRContext::TakeNextUniqueId(c);
  this->unique_id_ = uVar2;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dbg_scope_ = *dbg_scope;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
            (&this->operands_,(ulong)inst->num_operands);
  lVar4 = 4;
  for (uVar3 = 0; uVar3 < inst->num_operands; uVar3 = uVar3 + 1) {
    psVar1 = inst->operands;
    local_38 = inst->words + *(ushort *)((long)psVar1 + lVar4 + -4);
    local_40 = local_38 + *(ushort *)((long)psVar1 + lVar4 + -2);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t_const&,unsigned_int_const*,unsigned_int_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,(spv_operand_type_t *)((long)&psVar1->offset + lVar4),&local_38,
               &local_40);
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

Instruction::Instruction(IRContext* c, const spv_parsed_instruction_t& inst,
                         const DebugScope& dbg_scope)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(static_cast<spv::Op>(inst.opcode)),
      has_type_id_(inst.type_id != 0),
      has_result_id_(inst.result_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      dbg_scope_(dbg_scope) {
  operands_.reserve(inst.num_operands);
  for (uint32_t i = 0; i < inst.num_operands; ++i) {
    const auto& current_payload = inst.operands[i];
    operands_.emplace_back(
        current_payload.type, inst.words + current_payload.offset,
        inst.words + current_payload.offset + current_payload.num_words);
  }
}